

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

INTERP_PRED_TYPE
is_pred_filter_search_allowed
          (AV1_COMP *cpi,MACROBLOCKD *xd,BLOCK_SIZE bsize,int_interpfilters *af,
          int_interpfilters *lf)

{
  int iVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  short *in_RCX;
  byte in_DL;
  int *in_RSI;
  long in_RDI;
  short *in_R8;
  bool bVar7;
  bool bVar8;
  int pred_filter_enable;
  int mi_col;
  int mi_row;
  INTERP_PRED_TYPE pred_filter_type;
  int is_vert_eq;
  int is_horiz_eq;
  int bsl;
  MB_MODE_INFO *left_mbmi;
  MB_MODE_INFO *above_mbmi;
  AV1_COMMON *cm;
  bool local_65;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  lVar2 = *(long *)(in_RSI + 0x7b4);
  lVar3 = *(long *)(in_RSI + 0x7b2);
  bVar4 = ""[in_DL];
  bVar7 = false;
  bVar8 = false;
  if ((lVar2 != 0) &&
     (iVar5 = is_inter_block((MB_MODE_INFO *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)),
     iVar5 != 0)) {
    *(undefined4 *)in_RCX = *(undefined4 *)(lVar2 + 0x14);
  }
  if ((lVar3 != 0) &&
     (iVar5 = is_inter_block((MB_MODE_INFO *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)),
     iVar5 != 0)) {
    *(undefined4 *)in_R8 = *(undefined4 *)(lVar3 + 0x14);
  }
  if (in_RCX[1] != 0xff) {
    bVar7 = in_RCX[1] == in_R8[1];
  }
  if (*in_RCX != 0xff) {
    bVar8 = *in_RCX == *in_R8;
  }
  iVar5 = *in_RSI;
  iVar1 = in_RSI[1];
  if (*(int *)(in_RDI + 0x60b50) == 0) {
    bVar4 = 0;
  }
  else {
    iVar6 = get_chessboard_index(*(int *)(in_RDI + 0x3bf90));
    bVar4 = (char)(iVar5 + iVar1 >> (bVar4 & 0x1f)) + (char)iVar6 & 1;
  }
  local_65 = bVar7 || bVar8 != false;
  return (local_65 & bVar4) * (bVar8 * '\x02' + bVar7);
}

Assistant:

static inline INTERP_PRED_TYPE is_pred_filter_search_allowed(
    const AV1_COMP *const cpi, MACROBLOCKD *xd, BLOCK_SIZE bsize,
    int_interpfilters *af, int_interpfilters *lf) {
  const AV1_COMMON *cm = &cpi->common;
  const MB_MODE_INFO *const above_mbmi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mbmi = xd->left_mbmi;
  const int bsl = mi_size_wide_log2[bsize];
  int is_horiz_eq = 0, is_vert_eq = 0;

  if (above_mbmi && is_inter_block(above_mbmi))
    *af = above_mbmi->interp_filters;

  if (left_mbmi && is_inter_block(left_mbmi)) *lf = left_mbmi->interp_filters;

  if (af->as_filters.x_filter != INTERP_INVALID)
    is_horiz_eq = af->as_filters.x_filter == lf->as_filters.x_filter;
  if (af->as_filters.y_filter != INTERP_INVALID)
    is_vert_eq = af->as_filters.y_filter == lf->as_filters.y_filter;

  INTERP_PRED_TYPE pred_filter_type = (is_vert_eq << 1) + is_horiz_eq;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  int pred_filter_enable =
      cpi->sf.interp_sf.cb_pred_filter_search
          ? (((mi_row + mi_col) >> bsl) +
             get_chessboard_index(cm->current_frame.frame_number)) &
                0x1
          : 0;
  pred_filter_enable &= is_horiz_eq || is_vert_eq;
  // pred_filter_search = 0: pred_filter is disabled
  // pred_filter_search = 1: pred_filter is enabled and only horz pred matching
  // pred_filter_search = 2: pred_filter is enabled and only vert pred matching
  // pred_filter_search = 3: pred_filter is enabled and
  //                         both vert, horz pred matching
  return pred_filter_enable * pred_filter_type;
}